

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackArchiveGenerator.cxx
# Opt level: O0

int __thiscall cmCPackArchiveGenerator::PackageComponentsAllInOne(cmCPackArchiveGenerator *this)

{
  Compress c;
  cmCPackLog *pcVar1;
  bool bVar2;
  int iVar3;
  reference pvVar4;
  string *psVar5;
  undefined4 extraout_var;
  ostream *poVar6;
  char *pcVar7;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>_>
  *this_00;
  reference ppVar8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>
  *comp;
  iterator __end1;
  iterator __begin1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>_>
  *__range1;
  Deduplicator deduplicator;
  string local_a80;
  undefined1 local_a60 [8];
  ostringstream cmCPackLog_msg_3;
  string local_8e8 [32];
  string local_8c8;
  undefined1 local_8a8 [8];
  ostringstream cmCPackLog_msg_2;
  undefined1 local_730 [8];
  cmArchiveWrite archive;
  string local_648 [32];
  undefined1 local_628 [8];
  ostringstream cmCPackLog_msg_1;
  undefined1 local_4b0 [8];
  cmGeneratedFileStream gf;
  ostringstream local_228 [8];
  ostringstream cmCPackLog_msg;
  allocator<char> local_a9;
  string local_a8;
  cmValue local_88;
  allocator<char> local_79;
  string local_78;
  cmValue local_58 [3];
  allocator<char> local_39;
  string local_38;
  cmCPackArchiveGenerator *local_18;
  cmCPackArchiveGenerator *this_local;
  
  this_01 = &(this->super_cmCPackGenerator).packageFileNames;
  local_18 = this;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(this_01);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string&>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_01,
             &(this->super_cmCPackGenerator).toplevel);
  pvVar4 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](this_01,0);
  std::__cxx11::string::operator+=((string *)pvVar4,"/");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"CPACK_ARCHIVE_FILE_NAME",&local_39);
  bVar2 = cmCPackGenerator::IsSet(&this->super_cmCPackGenerator,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"CPACK_ARCHIVE_FILE_NAME",&local_79);
    local_58[0] = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_78);
    psVar5 = cmValue::operator*[abi_cxx11_(local_58);
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&(this->super_cmCPackGenerator).packageFileNames,0);
    std::__cxx11::string::operator+=((string *)pvVar4,(string *)psVar5);
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator(&local_79);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a8,"CPACK_PACKAGE_FILE_NAME",&local_a9);
    local_88 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_a8);
    psVar5 = cmValue::operator*[abi_cxx11_(&local_88);
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&(this->super_cmCPackGenerator).packageFileNames,0);
    std::__cxx11::string::operator+=((string *)pvVar4,(string *)psVar5);
    std::__cxx11::string::~string((string *)&local_a8);
    std::allocator<char>::~allocator(&local_a9);
  }
  iVar3 = (*(this->super_cmCPackGenerator)._vptr_cmCPackGenerator[4])();
  pvVar4 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](&(this->super_cmCPackGenerator).packageFileNames,0);
  std::__cxx11::string::operator+=((string *)pvVar4,(char *)CONCAT44(extraout_var,iVar3));
  std::__cxx11::ostringstream::ostringstream(local_228);
  poVar6 = std::operator<<((ostream *)local_228,
                           "Packaging all groups in one package...(CPACK_COMPONENTS_ALL_GROUPS_IN_ONE_PACKAGE is set)"
                          );
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  pcVar1 = (this->super_cmCPackGenerator).Logger;
  std::__cxx11::ostringstream::str();
  pcVar7 = (char *)std::__cxx11::string::c_str();
  cmCPackLog::Log(pcVar1,2,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                  ,0x1a3,pcVar7);
  std::__cxx11::string::~string((string *)&gf.field_0x260);
  std::__cxx11::ostringstream::~ostringstream(local_228);
  cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)local_4b0,None);
  pvVar4 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](&(this->super_cmCPackGenerator).packageFileNames,0);
  cmGeneratedFileStream::Open((cmGeneratedFileStream *)local_4b0,pvVar4,false,true);
  iVar3 = (*(this->super_cmCPackGenerator)._vptr_cmCPackGenerator[0x1c])(this,local_4b0);
  if (iVar3 == 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_628);
    poVar6 = std::operator<<((ostream *)local_628,"Problem to generate Header for archive <");
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&(this->super_cmCPackGenerator).packageFileNames,0);
    poVar6 = std::operator<<(poVar6,(string *)pvVar4);
    poVar6 = std::operator<<(poVar6,">.");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    pcVar1 = (this->super_cmCPackGenerator).Logger;
    std::__cxx11::ostringstream::str();
    pcVar7 = (char *)std::__cxx11::string::c_str();
    cmCPackLog::Log(pcVar1,0x10,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                    ,0x1a4,pcVar7);
    std::__cxx11::string::~string(local_648);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_628);
    this_local._4_4_ = 0;
    archive.PermissionsMask.IsValueSet = true;
    archive.PermissionsMask._5_3_ = 0;
  }
  else {
    c = this->Compress;
    iVar3 = GetThreadCount(this);
    cmArchiveWrite::cmArchiveWrite
              ((cmArchiveWrite *)local_730,(ostream *)local_4b0,c,&this->ArchiveFormat,0,iVar3);
    bVar2 = cmArchiveWrite::Open((cmArchiveWrite *)local_730);
    if (bVar2) {
      bVar2 = cmArchiveWrite::operator!((cmArchiveWrite *)local_730);
      if (bVar2) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_a60);
        poVar6 = std::operator<<((ostream *)local_a60,"Problem to create archive <");
        pvVar4 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](&(this->super_cmCPackGenerator).packageFileNames,0);
        poVar6 = std::operator<<(poVar6,(string *)pvVar4);
        poVar6 = std::operator<<(poVar6,">, ERROR = ");
        cmArchiveWrite::GetError_abi_cxx11_(&local_a80,(cmArchiveWrite *)local_730);
        poVar6 = std::operator<<(poVar6,(string *)&local_a80);
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string((string *)&local_a80);
        pcVar1 = (this->super_cmCPackGenerator).Logger;
        std::__cxx11::ostringstream::str();
        pcVar7 = (char *)std::__cxx11::string::c_str();
        cmCPackLog::Log(pcVar1,0x10,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                        ,0x1a4,pcVar7);
        std::__cxx11::string::~string((string *)&deduplicator.Files._M_h._M_single_bucket);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_a60);
        this_local._4_4_ = 0;
        archive.PermissionsMask.IsValueSet = true;
        archive.PermissionsMask._5_3_ = 0;
      }
      else {
        Deduplicator::Deduplicator((Deduplicator *)&__range1);
        this_00 = &(this->super_cmCPackGenerator).Components;
        __end1 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>_>
                 ::begin(this_00);
        comp = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>
                *)std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>_>
                  ::end(this_00);
        while( true ) {
          bVar2 = std::operator!=(&__end1,(_Self *)&comp);
          if (!bVar2) break;
          ppVar8 = std::
                   _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>
                   ::operator*(&__end1);
          addOneComponentToArchive
                    (this,(cmArchiveWrite *)local_730,&ppVar8->second,(Deduplicator *)&__range1);
          std::
          _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>
          ::operator++(&__end1);
        }
        this_local._4_4_ = 1;
        archive.PermissionsMask.IsValueSet = true;
        archive.PermissionsMask._5_3_ = 0;
        Deduplicator::~Deduplicator((Deduplicator *)&__range1);
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_8a8);
      poVar6 = std::operator<<((ostream *)local_8a8,"Problem to open archive <");
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&(this->super_cmCPackGenerator).packageFileNames,0);
      poVar6 = std::operator<<(poVar6,(string *)pvVar4);
      poVar6 = std::operator<<(poVar6,">, ERROR = ");
      cmArchiveWrite::GetError_abi_cxx11_(&local_8c8,(cmArchiveWrite *)local_730);
      poVar6 = std::operator<<(poVar6,(string *)&local_8c8);
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string((string *)&local_8c8);
      pcVar1 = (this->super_cmCPackGenerator).Logger;
      std::__cxx11::ostringstream::str();
      pcVar7 = (char *)std::__cxx11::string::c_str();
      cmCPackLog::Log(pcVar1,0x10,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                      ,0x1a4,pcVar7);
      std::__cxx11::string::~string(local_8e8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_8a8);
      this_local._4_4_ = 0;
      archive.PermissionsMask.IsValueSet = true;
      archive.PermissionsMask._5_3_ = 0;
    }
    cmArchiveWrite::~cmArchiveWrite((cmArchiveWrite *)local_730);
  }
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_4b0);
  return this_local._4_4_;
}

Assistant:

int cmCPackArchiveGenerator::PackageComponentsAllInOne()
{
  // reset the package file names
  this->packageFileNames.clear();
  this->packageFileNames.emplace_back(this->toplevel);
  this->packageFileNames[0] += "/";

  if (this->IsSet("CPACK_ARCHIVE_FILE_NAME")) {
    this->packageFileNames[0] += *this->GetOption("CPACK_ARCHIVE_FILE_NAME");
  } else {
    this->packageFileNames[0] += *this->GetOption("CPACK_PACKAGE_FILE_NAME");
  }

  this->packageFileNames[0] += this->GetOutputExtension();

  cmCPackLogger(cmCPackLog::LOG_VERBOSE,
                "Packaging all groups in one package..."
                "(CPACK_COMPONENTS_ALL_GROUPS_IN_ONE_PACKAGE is set)"
                  << std::endl);
  DECLARE_AND_OPEN_ARCHIVE(packageFileNames[0], archive);

  Deduplicator deduplicator;

  // The ALL COMPONENTS in ONE package case
  for (auto& comp : this->Components) {
    // Add the files of this component to the archive
    this->addOneComponentToArchive(archive, &(comp.second), &deduplicator);
  }

  // archive goes out of scope so it will finalized and closed.
  return 1;
}